

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNESTMeanYieldsBenchmarks.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<NEST::LArInteraction> *this;
  double energy;
  LArInteraction species;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<NEST::LArInteraction> __l_03;
  size_t sVar1;
  pointer pdVar2;
  int iVar3;
  VDetector *detector_00;
  RandomGen *this_00;
  pointer pdVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  ostream *poVar9;
  undefined1 auVar10 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b88;
  LArNESTResult local_b40;
  ulong local_ac0;
  size_t i_1;
  size_t v;
  double local_aa8 [9];
  iterator local_a60;
  undefined8 local_a58;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_a50;
  const_iterator local_a48;
  double *local_a40;
  double local_a38 [11];
  iterator local_9e0;
  undefined8 local_9d8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_9d0;
  const_iterator local_9c8;
  double *local_9c0;
  double local_9b8 [10];
  iterator local_968;
  undefined8 local_960;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_958;
  const_iterator local_950;
  undefined1 local_948 [8];
  vector<double,_std::allocator<double>_> electric_field;
  size_t k;
  ofstream output_file;
  undefined1 local_728 [8];
  LArNESTResult result;
  LArNEST larnest;
  LArDetector *detector;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120 [32];
  string local_100 [32];
  iterator local_e0;
  size_type local_d8;
  undefined1 local_d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  particle_type;
  undefined1 local_98 [8];
  vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> particle_types;
  double local_70;
  ulong local_68;
  size_t i;
  double step_size;
  double end_val;
  double start_val;
  vector<double,_std::allocator<double>_> energy_vals;
  uint64_t uStack_28;
  int num_energy_steps;
  uint64_t seed;
  double density;
  char **argv_local;
  int argc_local;
  
  seed = 0x3ff649ba5e353f7d;
  uStack_28 = 0;
  if (1 < argc) {
    seed = (uint64_t)atof(argv[1]);
  }
  if (2 < argc) {
    iVar3 = atoi(argv[2]);
    uStack_28 = (uint64_t)iVar3;
  }
  energy_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 50000;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&start_val);
  end_val = 0.1;
  step_size = 1000.0;
  i = (size_t)(999.9 / (double)energy_vals.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  for (local_68 = 0;
      local_68 <
      (ulong)(long)energy_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_; local_68 = local_68 + 1) {
    auVar10._8_4_ = (int)(local_68 >> 0x20);
    auVar10._0_8_ = local_68;
    auVar10._12_4_ = 0x45300000;
    local_70 = (double)i *
               ((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_68) - 4503599627370496.0)) + end_val;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)&start_val,&local_70);
  }
  particle_type.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  this = (allocator<NEST::LArInteraction> *)
         ((long)&particle_type.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<NEST::LArInteraction>::allocator(this);
  __l_03._M_len = 3;
  __l_03._M_array =
       (iterator)
       ((long)&particle_type.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  std::vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>::vector
            ((vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> *)local_98,__l_03,
             this);
  std::allocator<NEST::LArInteraction>::~allocator
            ((allocator<NEST::LArInteraction> *)
             ((long)&particle_type.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  detector._4_1_ = 1;
  local_148 = &local_140;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"NR",(allocator<char> *)((long)&detector + 7));
  local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"ER",(allocator<char> *)((long)&detector + 6));
  local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,"Alpha",(allocator<char> *)((long)&detector + 5));
  detector._4_1_ = 0;
  local_e0 = &local_140;
  local_d8 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&detector + 3));
  __l_02._M_len = local_d8;
  __l_02._M_array = local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d0,__l_02,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&detector + 3));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&detector + 3));
  local_b88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0;
  do {
    local_b88 = local_b88 + -1;
    std::__cxx11::string::~string((string *)local_b88);
  } while (local_b88 != &local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)&detector + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&detector + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&detector + 7));
  detector_00 = (VDetector *)operator_new(0x128);
  LArDetector::LArDetector((LArDetector *)detector_00);
  NEST::LArNEST::LArNEST
            ((LArNEST *)
             &result.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,detector_00);
  this_00 = RandomGen::rndm();
  RandomGen::SetSeed(this_00,uStack_28);
  NEST::LArNESTResult::LArNESTResult((LArNESTResult *)local_728);
  std::ofstream::ofstream(&k);
  std::ofstream::open(&k,"mean_yields_benchmarks.csv",0x10);
  std::operator<<((ostream *)&k,
                  "type,energy,efield,TotalYield,QuantaYield,LightYield,Nph,Ne,Nex,Nion,TotalYield_std,QuantaYield_std,LightYield_std,Nph_std,Ne_std,Nex_std,Nion_std\n"
                 );
  for (electric_field.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pdVar2 = electric_field.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
      pdVar4 = (pointer)std::vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>::
                        size((vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> *)
                             local_98), pdVar2 < pdVar4;
      electric_field.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)electric_field.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_948);
    pvVar5 = std::vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>::operator[]
                       ((vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> *)
                        local_98,(size_type)
                                 electric_field.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (*pvVar5 == NR) {
      local_958._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)local_948);
      __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
      __normal_iterator<double*>
                ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
                 &local_950,&local_958);
      local_9b8[8] = 1750.0;
      local_9b8[9] = 2000.0;
      local_9b8[6] = 1000.0;
      local_9b8[7] = 1500.0;
      local_9b8[4] = 250.0;
      local_9b8[5] = 500.0;
      local_9b8[2] = 100.0;
      local_9b8[3] = 200.0;
      local_9b8[0] = 1.0;
      local_9b8[1] = 50.0;
      local_968 = local_9b8;
      local_960 = 10;
      __l_01._M_len = 10;
      __l_01._M_array = local_968;
      local_9c0 = (double *)
                  std::vector<double,_std::allocator<double>_>::insert
                            ((vector<double,_std::allocator<double>_> *)local_948,local_950,__l_01);
    }
    else {
      pvVar5 = std::vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>::operator[]
                         ((vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> *)
                          local_98,(size_type)
                                   electric_field.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
      if (*pvVar5 == ER) {
        local_9d0._M_current =
             (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)local_948);
        __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
        __normal_iterator<double*>
                  ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
                   &local_9c8,&local_9d0);
        local_a38[8] = 9000.0;
        local_a38[9] = 9500.0;
        local_a38[6] = 2500.0;
        local_a38[7] = 6000.0;
        local_a38[4] = 1000.0;
        local_a38[5] = 1500.0;
        local_a38[2] = 200.0;
        local_a38[3] = 600.0;
        local_a38[0] = 1.0;
        local_a38[1] = 100.0;
        local_9e0 = local_a38;
        local_9d8 = 10;
        __l_00._M_len = 10;
        __l_00._M_array = local_9e0;
        local_a40 = (double *)
                    std::vector<double,_std::allocator<double>_>::insert
                              ((vector<double,_std::allocator<double>_> *)local_948,local_9c8,__l_00
                              );
      }
      else {
        local_a50._M_current =
             (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)local_948);
        __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
        __normal_iterator<double*>
                  ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
                   &local_a48,&local_a50);
        local_aa8[6] = 10000.0;
        local_aa8[7] = 20000.0;
        local_aa8[4] = 1000.0;
        local_aa8[5] = 5000.0;
        local_aa8[2] = 100.0;
        local_aa8[3] = 500.0;
        local_aa8[0] = 1.0;
        local_aa8[1] = 50.0;
        local_a60 = local_aa8;
        local_a58 = 8;
        __l._M_len = 8;
        __l._M_array = local_a60;
        v = (size_t)std::vector<double,_std::allocator<double>_>::insert
                              ((vector<double,_std::allocator<double>_> *)local_948,local_a48,__l);
      }
    }
    for (i_1 = 0; sVar1 = i_1,
        sVar6 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)local_948), sVar1 < sVar6;
        i_1 = i_1 + 1) {
      for (local_ac0 = 0;
          local_ac0 <
          (ulong)(long)energy_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_; local_ac0 = local_ac0 + 1) {
        pvVar5 = std::vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>::
                 operator[]((vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> *)
                            local_98,(size_type)
                                     electric_field.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
        species = *pvVar5;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&start_val,local_ac0);
        energy = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_948,i_1);
        NEST::LArNEST::FullCalculation
                  (&local_b40,
                   (LArNEST *)
                   &result.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,species,energy,0.0,*pvVar7,
                   (double)seed,false);
        NEST::LArNESTResult::operator=((LArNESTResult *)local_728,&local_b40);
        NEST::LArNESTResult::~LArNESTResult(&local_b40);
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_d0,
                              (size_type)
                              electric_field.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
        poVar9 = std::operator<<((ostream *)&k,(string *)pvVar8);
        std::operator<<(poVar9,",");
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&start_val,local_ac0);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&k,*pvVar7);
        std::operator<<(poVar9,",");
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_948,i_1);
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&k,*pvVar7);
        std::operator<<(poVar9,",");
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&k,(double)local_728);
        std::operator<<(poVar9,",");
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&k,result.yields.TotalYield);
        std::operator<<(poVar9,",");
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&k,result.yields.QuantaYield);
        std::operator<<(poVar9,",");
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&k,result.yields.LightYield);
        std::operator<<(poVar9,",");
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&k,result.yields.Nph);
        std::operator<<(poVar9,",");
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&k,result.yields.Ne);
        std::operator<<(poVar9,",");
        poVar9 = (ostream *)std::ostream::operator<<((ostream *)&k,result.yields.Nex);
        std::operator<<(poVar9,",0,0,0,0,0,0,0\n");
      }
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_948);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&k);
  NEST::LArNESTResult::~LArNESTResult((LArNESTResult *)local_728);
  NEST::LArNEST::~LArNEST
            ((LArNEST *)
             &result.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d0);
  std::vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>::~vector
            ((vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> *)local_98);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&start_val);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  // this sample program takes can take two arguments,
  // (optional) 1) density - the density of the LAr to use
  // (optional) 2) seed - a seed for the random number generator

  double density = 1.393;
  uint64_t seed = 0;
  if (argc > 1) {
    density = atof(argv[1]);
  }
  if (argc > 2) {
    seed = atoi(argv[2]);
  }

  // set up energy steps
  int num_energy_steps = 50000;
  std::vector<double> energy_vals;
  double start_val = .1;
  double end_val = 1000;
  double step_size = (end_val - start_val) / num_energy_steps;

  for (size_t i = 0; i < num_energy_steps; i++) {
    energy_vals.emplace_back(start_val + step_size * i);
  }
  std::vector<NEST::LArInteraction> particle_types = {
      NEST::LArInteraction::NR, NEST::LArInteraction::ER,
      NEST::LArInteraction::Alpha};
  std::vector<std::string> particle_type = {"NR", "ER", "Alpha"};

  LArDetector* detector = new LArDetector();
  // Construct NEST class using detector object
  NEST::LArNEST larnest(detector);
  // Set random seed of RandomGen class
  RandomGen::rndm()->SetSeed(seed);

  // Construct NEST objects for storing calculation results
  NEST::LArNESTResult result;
  std::ofstream output_file;

  output_file.open("mean_yields_benchmarks.csv");
  output_file << "type,energy,efield,TotalYield,QuantaYield,LightYield,Nph,Ne,"
                 "Nex,Nion,TotalYield_std,QuantaYield_std,LightYield_std,Nph_"
                 "std,Ne_std,Nex_std,Nion_std\n";

  // iterate over electric field values
  for (size_t k = 0; k < particle_types.size(); k++) {
    std::vector<double> electric_field;
    if (particle_types[k] == NEST::LArInteraction::NR) {
      electric_field.insert(electric_field.end(), {1, 50, 100, 200, 250, 500,
                                                   1000, 1500, 1750, 2000});
    } else if (particle_types[k] == NEST::LArInteraction::ER) {
      electric_field.insert(electric_field.end(), {1, 100, 200, 600, 1000, 1500,
                                                   2500, 6000, 9000, 9500});
    } else {
      electric_field.insert(electric_field.end(),
                            {1, 50, 100, 500, 1000, 5000, 10000, 20000});
    }
    for (size_t v = 0; v < electric_field.size(); v++) {
      // iterate over energy values
      for (size_t i = 0; i < num_energy_steps; i++) {
        result = larnest.FullCalculation(particle_types[k], energy_vals[i], 0,
                                         electric_field[v], density, false);
        output_file << particle_type[k] << ",";
        output_file << energy_vals[i] << ",";
        output_file << electric_field[v] << ",";
        output_file << result.yields.TotalYield << ",";
        output_file << result.yields.QuantaYield << ",";
        output_file << result.yields.LightYield << ",";
        output_file << result.yields.Nph << ",";
        output_file << result.yields.Ne << ",";
        output_file << result.yields.Nex << ",";
        output_file << result.yields.Nion << ",0,0,0,0,0,0,0\n";
      }
    }
  }
  output_file.close();
  return 0;
}